

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_map.h
# Opt level: O1

void __thiscall
lemon::
VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_double>::
add(VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_double>
    *this,vector<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_> *keys)

{
  int iVar1;
  pointer pAVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  iVar3 = (int)((ulong)((long)(this->container).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->container).super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3);
  pAVar2 = (keys->
           super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (uint)((ulong)((long)(keys->
                               super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2) >> 2);
  if (0 < (int)uVar4) {
    iVar3 = iVar3 + -1;
    uVar5 = 0;
    do {
      iVar1 = pAVar2[uVar5]._id;
      if (iVar3 < iVar1) {
        iVar3 = iVar1;
      }
      uVar5 = uVar5 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar5);
    iVar3 = iVar3 + 1;
  }
  std::vector<double,_std::allocator<double>_>::resize(&this->container,(long)iVar3);
  return;
}

Assistant:

virtual void add(const std::vector<Key>& keys) {
    int max = container.size() - 1;
    for (int i = 0; i < int(keys.size()); ++i) {
      int id = Parent::notifier()->id(keys[i]);
      if (id >= max) {
        max = id;
      }
    }
    container.resize(max + 1);
  }